

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

bool __thiscall snappy::SnappyDecompressor::RefillTag(SnappyDecompressor *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint *puVar2;
  uint local_54;
  uint local_50;
  uint local_4c;
  void *pvStack_48;
  uint32 to_add;
  char *src;
  size_t length;
  uint32 nbuf;
  uint32 needed;
  uint32 entry;
  uchar c;
  size_t n;
  char *ip;
  SnappyDecompressor *this_local;
  
  n = (size_t)this->ip_;
  ip = (char *)this;
  if ((char *)n == this->ip_limit_) {
    (*this->reader_->_vptr_Source[4])(this->reader_,(ulong)this->peeked_);
    iVar1 = (*this->reader_->_vptr_Source[3])(this->reader_,&entry);
    n = CONCAT44(extraout_var,iVar1);
    this->peeked_ = (uint32)_entry;
    if (_entry == 0) {
      this->eof_ = true;
      return false;
    }
    this->ip_limit_ = (char *)(n + _entry);
  }
  if (this->ip_limit_ <= n) {
    __assert_fail("ip < ip_limit_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/snappy/snappy.cc"
                  ,0x32b,"bool snappy::SnappyDecompressor::RefillTag()");
  }
  needed._3_1_ = *(byte *)n;
  nbuf = (uint32)*(ushort *)(char_table + (ulong)needed._3_1_ * 2);
  length._4_4_ = (*(ushort *)(char_table + (ulong)needed._3_1_ * 2) >> 0xb) + 1;
  if (5 < length._4_4_) {
    __assert_fail("needed <= sizeof(scratch_)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/snappy/snappy.cc"
                  ,0x32f,"bool snappy::SnappyDecompressor::RefillTag()");
  }
  length._0_4_ = (int)this->ip_limit_ - (int)n;
  if ((uint)length < length._4_4_) {
    memmove(this->scratch_,(void *)n,(ulong)(uint)length);
    (*this->reader_->_vptr_Source[4])(this->reader_,(ulong)this->peeked_);
    this->peeked_ = 0;
    while ((uint)length < length._4_4_) {
      iVar1 = (*this->reader_->_vptr_Source[3])(this->reader_,&src);
      pvStack_48 = (void *)CONCAT44(extraout_var_00,iVar1);
      if (src == (char *)0x0) {
        return false;
      }
      local_50 = length._4_4_ - (uint)length;
      local_54 = (uint)src;
      puVar2 = std::min<unsigned_int>(&local_50,&local_54);
      local_4c = *puVar2;
      memcpy(this->scratch_ + (uint)length,pvStack_48,(ulong)local_4c);
      length._0_4_ = local_4c + (uint)length;
      (*this->reader_->_vptr_Source[4])(this->reader_,(ulong)local_4c);
    }
    if ((uint)length != length._4_4_) {
      __assert_fail("nbuf == needed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/snappy/snappy.cc"
                    ,0x344,"bool snappy::SnappyDecompressor::RefillTag()");
    }
    this->ip_ = this->scratch_;
    this->ip_limit_ = this->scratch_ + length._4_4_;
  }
  else if ((uint)length < 5) {
    memmove(this->scratch_,(void *)n,(ulong)(uint)length);
    (*this->reader_->_vptr_Source[4])(this->reader_,(ulong)this->peeked_);
    this->peeked_ = 0;
    this->ip_ = this->scratch_;
    this->ip_limit_ = this->scratch_ + (uint)length;
  }
  else {
    this->ip_ = (char *)n;
  }
  return true;
}

Assistant:

bool SnappyDecompressor::RefillTag() {
  const char* ip = ip_;
  if (ip == ip_limit_) {
    // Fetch a new fragment from the reader
    reader_->Skip(peeked_);   // All peeked bytes are used up
    size_t n;
    ip = reader_->Peek(&n);
    peeked_ = n;
    if (n == 0) {
      eof_ = true;
      return false;
    }
    ip_limit_ = ip + n;
  }

  // Read the tag character
  assert(ip < ip_limit_);
  const unsigned char c = *(reinterpret_cast<const unsigned char*>(ip));
  const uint32 entry = char_table[c];
  const uint32 needed = (entry >> 11) + 1;  // +1 byte for 'c'
  assert(needed <= sizeof(scratch_));

  // Read more bytes from reader if needed
  uint32 nbuf = ip_limit_ - ip;
  if (nbuf < needed) {
    // Stitch together bytes from ip and reader to form the word
    // contents.  We store the needed bytes in "scratch_".  They
    // will be consumed immediately by the caller since we do not
    // read more than we need.
    memmove(scratch_, ip, nbuf);
    reader_->Skip(peeked_);  // All peeked bytes are used up
    peeked_ = 0;
    while (nbuf < needed) {
      size_t length;
      const char* src = reader_->Peek(&length);
      if (length == 0) return false;
      uint32 to_add = min<uint32>(needed - nbuf, length);
      memcpy(scratch_ + nbuf, src, to_add);
      nbuf += to_add;
      reader_->Skip(to_add);
    }
    assert(nbuf == needed);
    ip_ = scratch_;
    ip_limit_ = scratch_ + needed;
  } else if (nbuf < kMaximumTagLength) {
    // Have enough bytes, but move into scratch_ so that we do not
    // read past end of input
    memmove(scratch_, ip, nbuf);
    reader_->Skip(peeked_);  // All peeked bytes are used up
    peeked_ = 0;
    ip_ = scratch_;
    ip_limit_ = scratch_ + nbuf;
  } else {
    // Pass pointer to buffer returned by reader_.
    ip_ = ip;
  }
  return true;
}